

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O2

uint RDL_getRCPrototypes(RDL_data *data,RDL_cycle ***ptr)

{
  uint uVar1;
  uint uVar2;
  RDL_BCCGraph *pRVar3;
  RDL_URFinfo **ppRVar4;
  RDL_cfam *pRVar5;
  char *pcVar6;
  RDL_graph *pRVar7;
  RDL_node *pRVar8;
  ulong uVar9;
  RDL_cycle **ppRVar10;
  RDL_cycle *pRVar11;
  RDL_edge *paRVar12;
  RDL_URFinfo *pRVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint local_74;
  uint local_70;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    uVar17 = 0xffffffff;
  }
  else {
    if (data->nofURFs != 0) {
      pRVar3 = data->bccGraphs;
      uVar1 = pRVar3->nof_bcc;
      uVar17 = 0;
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        for (uVar14 = 0; data->nofURFsPerBCC[uVar9] != uVar14; uVar14 = uVar14 + 1) {
          uVar17 = uVar17 + data->urfInfoPerBCC[uVar9]->nofCFsPerURF[uVar14];
        }
      }
      ppRVar10 = (RDL_cycle **)malloc((ulong)uVar17 << 3);
      local_74 = 0;
      local_70 = 0;
      for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 1) {
        uVar2 = data->nofURFsPerBCC[uVar9];
        for (uVar14 = 0; uVar14 != uVar2; uVar14 = uVar14 + 1) {
          ppRVar4 = data->urfInfoPerBCC;
          pRVar13 = ppRVar4[uVar9];
          for (uVar15 = 0; uVar15 < pRVar13->nofCFsPerURF[uVar14]; uVar15 = uVar15 + 1) {
            pRVar5 = pRVar13->URFs[uVar14][uVar15];
            pcVar6 = pRVar5->prototype;
            pRVar11 = (RDL_cycle *)malloc(0x18);
            ppRVar10[local_70] = pRVar11;
            paRVar12 = (RDL_edge *)malloc((ulong)pRVar5->weight << 3);
            pRVar11->edges = paRVar12;
            pRVar13 = ppRVar4[uVar9];
            pRVar11->weight = pRVar13->URFs[uVar14][uVar15]->weight;
            pRVar11->urf = (uint)uVar14;
            pRVar11->rcf = local_74;
            pRVar7 = pRVar3->bcc_graphs[uVar9];
            uVar18 = 0;
            for (uVar16 = 0; uVar16 < pRVar7->E; uVar16 = uVar16 + 1) {
              if (pcVar6[uVar16] == '\x01') {
                pRVar8 = data->graph->edges[pRVar3->edge_from_bcc_mapping[uVar9][uVar16]];
                paRVar12[uVar18][0] = *pRVar8;
                paRVar12[uVar18][1] = pRVar8[1];
                uVar18 = uVar18 + 1;
              }
            }
            local_70 = local_70 + 1;
            local_74 = local_74 + 1;
          }
        }
      }
      goto LAB_001057f2;
    }
    uVar17 = 0;
  }
  ppRVar10 = (RDL_cycle **)malloc(8);
LAB_001057f2:
  *ptr = ppRVar10;
  return uVar17;
}

Assistant:

unsigned RDL_getRCPrototypes(const RDL_data *data, RDL_cycle ***ptr)
{
  RDL_cycle **result;
  unsigned nof_urf;
  unsigned nofRel=0, rcf=0;
  unsigned currFam=0, currEdge;
  unsigned i,j,k;
  const char* prototype;
  unsigned bcc_index, mapped_edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  if (data->nofURFs < 1) {
    (*ptr) = malloc(sizeof(**ptr));
    return 0;
  }

  for (i = 0; i < data->bccGraphs->nof_bcc; ++i) {
    for (j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      nofRel += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
  }

  /*allocate space*/
  result = malloc(nofRel * sizeof(*result));

  for (bcc_index = 0; bcc_index < data->bccGraphs->nof_bcc; ++bcc_index) {
    nof_urf = data->nofURFsPerBCC[bcc_index];
    for (i = 0; i < nof_urf; ++i) {
      for (j = 0; j < data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i]; ++j, ++rcf) {
        prototype = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->prototype;
        result[currFam] = malloc(sizeof(**result));
        result[currFam]->edges = malloc(data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight *
                                  sizeof(*result[currFam]->edges));
        result[currFam]->weight = data->urfInfoPerBCC[bcc_index]->URFs[i][j]->weight;
        result[currFam]->urf = i;
        result[currFam]->rcf = rcf;
        currEdge = 0;
        for (k = 0; k < data->bccGraphs->bcc_graphs[bcc_index]->E; ++k) {
          if (prototype[k] == 1) {
            mapped_edge = data->bccGraphs->edge_from_bcc_mapping[bcc_index][k];
            result[currFam]->edges[currEdge][0] = data->graph->edges[mapped_edge][0];
            result[currFam]->edges[currEdge][1] = data->graph->edges[mapped_edge][1];
            ++currEdge;
          }
        }
        ++currFam;
      }
    }
  }

  (*ptr) = result;
  return nofRel;
}